

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O1

void * __thiscall
btHashedSimplePairCache::removeOverlappingPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  btSimplePair *pbVar1;
  int *piVar2;
  int *piVar3;
  anon_union_8_2_fce4e415_for_btSimplePair_2 aVar4;
  uint uVar5;
  btSimplePair *pbVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  
  gRemoveSimplePairs = gRemoveSimplePairs + 1;
  uVar5 = indexB << 0x10 | indexA;
  uVar5 = ~(uVar5 << 0xf) + uVar5;
  uVar5 = ((int)uVar5 >> 10 ^ uVar5) * 9;
  uVar5 = (int)uVar5 >> 6 ^ uVar5;
  uVar5 = ~(uVar5 << 0xb) + uVar5;
  uVar11 = (long)(int)((int)uVar5 >> 0x10 ^ uVar5) &
           (long)(this->m_overlappingPairArray).m_capacity - 1U;
  iVar10 = (this->m_hashTable).m_data[uVar11];
  if (iVar10 != -1) {
    pbVar6 = (this->m_overlappingPairArray).m_data;
    do {
      if ((pbVar6[iVar10].m_indexA == indexA) && (pbVar6[iVar10].m_indexB == indexB)) {
        pbVar6 = pbVar6 + iVar10;
        goto LAB_00157a3c;
      }
      iVar10 = (this->m_next).m_data[iVar10];
    } while (iVar10 != -1);
  }
  pbVar6 = (btSimplePair *)0x0;
LAB_00157a3c:
  if (pbVar6 == (btSimplePair *)0x0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pbVar1 = (this->m_overlappingPairArray).m_data;
    piVar2 = (this->m_hashTable).m_data;
    piVar3 = piVar2 + uVar11;
    iVar10 = *piVar3;
    iVar13 = -1;
    iVar8 = (int)((ulong)((long)pbVar6 - (long)pbVar1) >> 4);
    if (iVar10 != iVar8) {
      do {
        iVar13 = iVar10;
        iVar10 = (this->m_next).m_data[iVar13];
      } while (iVar10 != iVar8);
    }
    pvVar7 = (pbVar6->field_2).m_userPointer;
    piVar12 = (this->m_next).m_data;
    piVar14 = piVar12 + iVar13;
    if (iVar13 == -1) {
      piVar14 = piVar3;
    }
    *piVar14 = piVar12[iVar8];
    lVar15 = (long)(this->m_overlappingPairArray).m_size;
    uVar11 = lVar15 - 1;
    iVar10 = (int)uVar11;
    if (iVar10 != iVar8) {
      pbVar6 = pbVar1 + uVar11;
      uVar5 = pbVar1[uVar11].m_indexB << 0x10 | pbVar1[uVar11].m_indexA;
      uVar5 = ~(uVar5 << 0xf) + uVar5;
      uVar5 = ((int)uVar5 >> 10 ^ uVar5) * 9;
      uVar5 = (int)uVar5 >> 6 ^ uVar5;
      uVar5 = ~(uVar5 << 0xb) + uVar5;
      uVar11 = (long)(int)((int)uVar5 >> 0x10 ^ uVar5) &
               (long)(this->m_overlappingPairArray).m_capacity - 1U;
      piVar2 = piVar2 + uVar11;
      iVar13 = *piVar2;
      iVar9 = -1;
      if (iVar13 != iVar10) {
        do {
          iVar9 = iVar13;
          iVar13 = (this->m_next).m_data[iVar9];
        } while (iVar13 != iVar10);
      }
      piVar3 = (this->m_next).m_data;
      piVar12 = piVar3 + iVar9;
      if (iVar9 == -1) {
        piVar12 = piVar2;
      }
      *piVar12 = piVar3[lVar15 + -1];
      iVar10 = pbVar6->m_indexB;
      aVar4 = pbVar6->field_2;
      pbVar1 = pbVar1 + iVar8;
      pbVar1->m_indexA = pbVar6->m_indexA;
      pbVar1->m_indexB = iVar10;
      pbVar1->field_2 = aVar4;
      piVar3 = (this->m_hashTable).m_data;
      (this->m_next).m_data[iVar8] = piVar3[uVar11];
      piVar3[uVar11] = iVar8;
      uVar11 = (ulong)((this->m_overlappingPairArray).m_size - 1);
    }
    (this->m_overlappingPairArray).m_size = (int)uVar11;
  }
  return pvVar7;
}

Assistant:

void* btHashedSimplePairCache::removeOverlappingPair(int indexA, int indexB)
{
	gRemoveSimplePairs++;
	

	/*if (indexA > indexB) 
		btSwap(indexA, indexB);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));

	btSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair == NULL)
	{
		return 0;
	}

	
	void* userData = pair->m_userPointer;


	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	btAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	btAssert(index != BT_SIMPLE_NULL_PAIR);

	int previous = BT_SIMPLE_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		btAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const btSimplePair* last = &m_overlappingPairArray[lastPairIndex];
		/* missing swap here too, Nat. */ 
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_indexA), static_cast<unsigned int>(last->m_indexB)) & (m_overlappingPairArray.capacity()-1));

	index = m_hashTable[lastHash];
	btAssert(index != BT_SIMPLE_NULL_PAIR);

	previous = BT_SIMPLE_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		btAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}